

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_ImpactGenerator.cpp
# Opt level: O0

ImpactInstance * ImpactGenerator::GetImpactInstance(int index)

{
  ImpactInstance *pIStack_10;
  int index_local;
  
  if ((index < 0) || (3 < index)) {
    pIStack_10 = (ImpactInstance *)0x0;
  }
  else {
    if ((GetImpactInstance::initialized[index] & 1U) == 0) {
      GetImpactInstance::initialized[index] = true;
      GetImpactInstance::instance[index].maximpacts = 1000;
      GetImpactInstance::instance[index].numimpacts = 0;
    }
    pIStack_10 = GetImpactInstance::instance + index;
  }
  return pIStack_10;
}

Assistant:

inline ImpactInstance* GetImpactInstance(int index)
    {
        static bool initialized[MAXINSTANCES] = { false };
        static ImpactInstance instance[MAXINSTANCES];
        if (index < 0 || index >= MAXINSTANCES)
            return NULL;
        if (!initialized[index])
        {
            initialized[index] = true;
            instance[index].maximpacts = MAXIMPACTS;
            instance[index].numimpacts = 0;
        }
        return &instance[index];
    }